

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obs2icrs.cpp
# Opt level: O0

void PrintResults(CEExecOptions *inputs,CESkyCoord *results)

{
  long *plVar1;
  long *in_RSI;
  string *in_RDI;
  double dVar2;
  string *in_stack_fffffffffffffc80;
  CLOptions *in_stack_fffffffffffffc88;
  CLOptions *this;
  undefined8 in_stack_fffffffffffffc90;
  CEDateType date_format;
  double in_stack_fffffffffffffc98;
  CEDate *in_stack_fffffffffffffca0;
  allocator *paVar3;
  undefined1 local_249 [40];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  undefined1 local_138 [64];
  CEAngle local_f8;
  undefined1 local_e8 [64];
  CEAngle local_a8;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  long *local_10;
  string *local_8;
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffc90 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  printf("\n");
  printf("******************************************\n");
  printf("* Results of Observed -> ICRS conversion *\n");
  printf("******************************************\n");
  printf("Observed Coordinates (input)\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"azimuth",&local_31);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  printf("    Azimuth        : %f degrees\n",dVar2);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"zenith",&local_69);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  printf("    Zenith         : %+f degrees\n",dVar2);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"zenith",&local_91);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  printf("    Altitude       : %+f degrees\n",90.0 - dVar2);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  printf("ICRS Coordinates (output)\n");
  plVar1 = local_10;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,date_format);
  (**(code **)(*plVar1 + 0x18))(&local_a8,plVar1,local_e8);
  dVar2 = CEAngle::Deg(&local_a8);
  printf("    Right Ascension: %f degrees\n",dVar2);
  CEAngle::~CEAngle((CEAngle *)0x1371b6);
  CEDate::~CEDate((CEDate *)0x1371c3);
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,date_format);
  (**(code **)(*local_10 + 0x20))(&local_f8,local_10,local_138);
  dVar2 = CEAngle::Deg(&local_f8);
  printf("    Declination    : %+f degrees\n",dVar2);
  CEAngle::~CEAngle((CEAngle *)0x137250);
  CEDate::~CEDate((CEDate *)0x13725d);
  printf("Observer Info\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"juliandate",&local_159);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  printf("    Julian Date    : %f\n",dVar2);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"longitude",&local_181);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  printf("    Longitude      : %f deg\n",dVar2);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"latitude",&local_1a9);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  printf("    Latitude       : %+f deg\n",dVar2);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"elevation",&local_1d1);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  printf("    Elevation      : %f meters\n",dVar2);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"pressure",&local_1f9);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  printf("    Pressure       : %f hPa\n",dVar2);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  paVar3 = &local_221;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"temperature",paVar3);
  dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  printf("    Temperature    : %f Celsius\n",dVar2);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  this = (CLOptions *)local_249;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_249 + 1),"humidity",(allocator *)this);
  dVar2 = CLOptions::AsDouble(this,local_8);
  printf("    Relative Humid.: %f\n",dVar2);
  std::__cxx11::string::~string((string *)(local_249 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_249);
  printf("\n");
  return;
}

Assistant:

void PrintResults(CEExecOptions&    inputs, 
                  const CESkyCoord& results)
{
    std::printf("\n") ;
    std::printf("******************************************\n") ;
    std::printf("* Results of Observed -> ICRS conversion *\n") ;
    std::printf("******************************************\n") ;
    std::printf("Observed Coordinates (input)\n") ;
    std::printf("    Azimuth        : %f degrees\n", inputs.AsDouble("azimuth")) ;
    std::printf("    Zenith         : %+f degrees\n", inputs.AsDouble("zenith")) ;
    std::printf("    Altitude       : %+f degrees\n", 90.0-inputs.AsDouble("zenith")) ;
    std::printf("ICRS Coordinates (output)\n") ;
    std::printf("    Right Ascension: %f degrees\n", results.XCoord().Deg()) ;
    std::printf("    Declination    : %+f degrees\n", results.YCoord().Deg()) ;
    std::printf("Observer Info\n") ;
    std::printf("    Julian Date    : %f\n", inputs.AsDouble("juliandate")) ;
    std::printf("    Longitude      : %f deg\n", inputs.AsDouble("longitude")) ;
    std::printf("    Latitude       : %+f deg\n", inputs.AsDouble("latitude")) ;
    std::printf("    Elevation      : %f meters\n", inputs.AsDouble("elevation")) ;
    std::printf("    Pressure       : %f hPa\n", inputs.AsDouble("pressure")) ;
    std::printf("    Temperature    : %f Celsius\n", inputs.AsDouble("temperature")) ;
    std::printf("    Relative Humid.: %f\n", inputs.AsDouble("humidity")) ;
    std::printf("\n") ;
}